

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superAnd.c
# Opt level: O0

Super2_Man_t * Super2_ManStart(void)

{
  Super2_Man_t *__s;
  Extra_MmFixed_t *pEVar1;
  stmm_table *psVar2;
  Super2_Man_t *pMan;
  
  __s = (Super2_Man_t *)malloc(0x18);
  memset(__s,0,0x18);
  pEVar1 = Extra_MmFixedStart(0x20);
  __s->pMem = pEVar1;
  psVar2 = stmm_init_table(st__ptrcmp,st__ptrhash);
  __s->tTable = psVar2;
  return __s;
}

Assistant:

Super2_Man_t * Super2_ManStart()
{
    Super2_Man_t * pMan;
    pMan = ABC_ALLOC( Super2_Man_t, 1 );
    memset( pMan, 0, sizeof(Super2_Man_t) );
    pMan->pMem   = Extra_MmFixedStart( sizeof(Super2_Gate_t) );
    pMan->tTable = stmm_init_table( st__ptrcmp, st__ptrhash );
    return pMan;
}